

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaValidateNotation
              (xmlSchemaValidCtxtPtr vctxt,xmlSchemaPtr schema,xmlNodePtr node,xmlChar *value,
              xmlSchemaValPtr *val,int valNeeded)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlSchemaNotationPtr pxVar4;
  xmlChar *name;
  xmlSchemaValPtr pxVar5;
  xmlNsPtr pxVar6;
  xmlChar *prefix;
  xmlChar *local_38;
  
  if ((vctxt != (xmlSchemaValidCtxtPtr)0x0) && (vctxt->schema == (xmlSchemaPtr)0x0)) {
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateNotation",
               "a schema is needed on the validation context",(xmlChar *)0x0,(xmlChar *)val);
    return -1;
  }
  iVar1 = xmlValidateQName(value,1);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_38 = (xmlChar *)0x0;
  pxVar2 = xmlSplitQName2(value,&local_38);
  if (local_38 == (xmlChar *)0x0) {
    pxVar4 = xmlSchemaGetNotation(schema,value,(xmlChar *)0x0);
    if (pxVar4 == (xmlSchemaNotationPtr)0x0) {
      return 1;
    }
    if (val != (xmlSchemaValPtr *)0x0 && valNeeded != 0) {
      pxVar2 = xmlStrdup(value);
      pxVar5 = xmlSchemaNewNOTATIONValue(pxVar2,(xmlChar *)0x0);
      *val = pxVar5;
      return -(uint)(pxVar5 == (xmlSchemaValPtr)0x0);
    }
    return 0;
  }
  if (vctxt == (xmlSchemaValidCtxtPtr)0x0) {
    if ((node == (xmlNodePtr)0x0) ||
       (pxVar6 = xmlSearchNs(node->doc,node,local_38), pxVar6 == (xmlNsPtr)0x0)) goto LAB_001c7de3;
    pxVar3 = pxVar6->href;
  }
  else {
    pxVar3 = xmlSchemaLookupNamespace(vctxt,local_38);
  }
  if (pxVar3 != (xmlChar *)0x0) {
    pxVar4 = xmlSchemaGetNotation(schema,pxVar2,pxVar3);
    if (pxVar4 == (xmlSchemaNotationPtr)0x0) {
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
      if (val != (xmlSchemaValPtr *)0x0 && valNeeded != 0) {
        name = xmlStrdup(pxVar2);
        pxVar3 = xmlStrdup(pxVar3);
        pxVar5 = xmlSchemaNewNOTATIONValue(name,pxVar3);
        *val = pxVar5;
        iVar1 = -(uint)(pxVar5 == (xmlSchemaValPtr)0x0);
      }
    }
    (*xmlFree)(local_38);
    (*xmlFree)(pxVar2);
    return iVar1;
  }
LAB_001c7de3:
  (*xmlFree)(local_38);
  (*xmlFree)(pxVar2);
  return 1;
}

Assistant:

static int
xmlSchemaValidateNotation(xmlSchemaValidCtxtPtr vctxt,
			  xmlSchemaPtr schema,
			  xmlNodePtr node,
			  const xmlChar *value,
			  xmlSchemaValPtr *val,
			  int valNeeded)
{
    int ret;

    if (vctxt && (vctxt->schema == NULL)) {
	VERROR_INT("xmlSchemaValidateNotation",
	    "a schema is needed on the validation context");
	return (-1);
    }
    ret = xmlValidateQName(value, 1);
    if (ret != 0)
	return (ret);
    {
	xmlChar *localName = NULL;
	xmlChar *prefix = NULL;

	localName = xmlSplitQName2(value, &prefix);
	if (prefix != NULL) {
	    const xmlChar *nsName = NULL;

	    if (vctxt != NULL)
		nsName = xmlSchemaLookupNamespace(vctxt, BAD_CAST prefix);
	    else if (node != NULL) {
		xmlNsPtr ns = xmlSearchNs(node->doc, node, prefix);
		if (ns != NULL)
		    nsName = ns->href;
	    } else {
		xmlFree(prefix);
		xmlFree(localName);
		return (1);
	    }
	    if (nsName == NULL) {
		xmlFree(prefix);
		xmlFree(localName);
		return (1);
	    }
	    if (xmlSchemaGetNotation(schema, localName, nsName) != NULL) {
		if ((valNeeded) && (val != NULL)) {
		    (*val) = xmlSchemaNewNOTATIONValue(xmlStrdup(localName),
						       xmlStrdup(nsName));
		    if (*val == NULL)
			ret = -1;
		}
	    } else
		ret = 1;
	    xmlFree(prefix);
	    xmlFree(localName);
	} else {
	    if (xmlSchemaGetNotation(schema, value, NULL) != NULL) {
		if (valNeeded && (val != NULL)) {
		    (*val) = xmlSchemaNewNOTATIONValue(
			BAD_CAST xmlStrdup(value), NULL);
		    if (*val == NULL)
			ret = -1;
		}
	    } else
		return (1);
	}
    }
    return (ret);
}